

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O0

TValue * lj_clib_index(lua_State *L,CLibrary *cl,GCstr *name)

{
  long lVar1;
  CTypeID CVar2;
  char *name_00;
  void *pvVar3;
  void *pvVar4;
  GCcdata *cd;
  void *p;
  char *sym;
  CType *ctt;
  CType *pCStack_130;
  CTypeID id;
  CType *ct;
  CTState *cts;
  TValue *tv;
  GCstr *name_local;
  CLibrary *cl_local;
  lua_State *L_local;
  CTState *cts_1;
  GCcdata *cd_1;
  CType *local_c0;
  GCobj *o;
  
  tv = (TValue *)name;
  name_local = (GCstr *)cl;
  cl_local = (CLibrary *)L;
  cts = (CTState *)lj_tab_setstr(L,cl->cache,name);
  if (*(uint64_t *)cts == 0xffffffffffffffff) {
    cts_1 = (CTState *)cl_local;
    ct = *(CType **)((long)cl_local[1].handle + 0x180);
    ((CTState *)ct)->L = (lua_State *)cl_local;
    L_local = (lua_State *)ct;
    CVar2 = lj_ctype_getname((CTState *)ct,&stack0xfffffffffffffed0,(GCstr *)&tv->gcr,0x1840);
    if (CVar2 == 0) {
      lj_err_callerv((lua_State *)cl_local,LJ_ERR_FFI_NODECL,tv + 3);
    }
    if (pCStack_130->info >> 0x1c == 0xb) {
      if (((*(uint *)(*(long *)ct + (ulong)(pCStack_130->info & 0xffff) * 0x18) & 0x800000) == 0) ||
         (-1 < (int)pCStack_130->size)) {
        cts->tab = (CType *)(double)(int)pCStack_130->size;
      }
      else {
        cts->tab = (CType *)(double)pCStack_130->size;
      }
    }
    else {
      name_00 = clib_extsym((CTState *)ct,pCStack_130,(GCstr *)&tv->gcr);
      pvVar3 = clib_getsym((CLibrary *)name_local,name_00);
      if (pvVar3 == (void *)0x0) {
        clib_error_((lua_State *)cl_local);
      }
      local_c0 = ct;
      cd_1._0_4_ = 8;
      cd_1._4_4_ = CVar2;
      pvVar4 = lj_mem_newgco((lua_State *)(ct->name).gcptr64,0x18);
      *(undefined1 *)((long)pvVar4 + 9) = 10;
      *(short *)((long)pvVar4 + 10) = (short)cd_1._4_4_;
      *(void **)((long)pvVar4 + 0x10) = pvVar3;
      cts->tab = (CType *)((ulong)pvVar4 | 0xfffa800000000000);
      if ((*(byte *)(*(long *)&name_local->marked + 8) & 4) != 0) {
        pvVar3 = cl_local[1].handle;
        lVar1 = *(long *)&name_local->marked;
        *(byte *)(lVar1 + 8) = *(byte *)(lVar1 + 8) & 0xfb;
        *(undefined8 *)(lVar1 + 0x18) = *(undefined8 *)((long)pvVar3 + 0x40);
        *(long *)((long)pvVar3 + 0x40) = lVar1;
      }
    }
  }
  return (TValue *)cts;
}

Assistant:

TValue *lj_clib_index(lua_State *L, CLibrary *cl, GCstr *name)
{
  TValue *tv = lj_tab_setstr(L, cl->cache, name);
  if (LJ_UNLIKELY(tvisnil(tv))) {
    CTState *cts = ctype_cts(L);
    CType *ct;
    CTypeID id = lj_ctype_getname(cts, &ct, name, CLNS_INDEX);
    if (!id)
      lj_err_callerv(L, LJ_ERR_FFI_NODECL, strdata(name));
    if (ctype_isconstval(ct->info)) {
      CType *ctt = ctype_child(cts, ct);
      lj_assertCTS(ctype_isinteger(ctt->info) && ctt->size <= 4,
		   "only 32 bit const supported");  /* NYI */
      if ((ctt->info & CTF_UNSIGNED) && (int32_t)ct->size < 0)
	setnumV(tv, (lua_Number)(uint32_t)ct->size);
      else
	setintV(tv, (int32_t)ct->size);
    } else {
      const char *sym = clib_extsym(cts, ct, name);
#if LJ_TARGET_WINDOWS
      DWORD oldwerr = GetLastError();
#endif
      void *p = clib_getsym(cl, sym);
      GCcdata *cd;
      lj_assertCTS(ctype_isfunc(ct->info) || ctype_isextern(ct->info),
		   "unexpected ctype %08x in clib", ct->info);
#if LJ_TARGET_X86 && LJ_ABI_WIN
      /* Retry with decorated name for fastcall/stdcall functions. */
      if (!p && ctype_isfunc(ct->info)) {
	CTInfo cconv = ctype_cconv(ct->info);
	if (cconv == CTCC_FASTCALL || cconv == CTCC_STDCALL) {
	  CTSize sz = clib_func_argsize(cts, ct);
	  const char *symd = lj_strfmt_pushf(L,
			       cconv == CTCC_FASTCALL ? "@%s@%d" : "_%s@%d",
			       sym, sz);
	  L->top--;
	  p = clib_getsym(cl, symd);
	}
      }
#endif
      if (!p)
	clib_error(L, "cannot resolve symbol " LUA_QS ": %s", sym);
#if LJ_TARGET_WINDOWS
      SetLastError(oldwerr);
#endif
      cd = lj_cdata_new(cts, id, CTSIZE_PTR);
      *(void **)cdataptr(cd) = p;
      setcdataV(L, tv, cd);
      lj_gc_anybarriert(L, cl->cache);
    }
  }
  return tv;
}